

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lookup.cpp
# Opt level: O0

bool slang::ast::anon_unknown_39::lookupUpward
               (span<const_slang::ast::(anonymous_namespace)::NamePlusLoc,_18446744073709551615UL>
                nameParts,NameComponents *name,ASTContext *context,
               bitmask<slang::ast::LookupFlags> flags,LookupResult *result)

{
  basic_string_view<char,_std::char_traits<char>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __x;
  string_view name_00;
  bool bVar1;
  Symbol *pSVar2;
  InstanceBodySymbol *pIVar3;
  DefinitionSymbol *pDVar4;
  long in_RDX;
  long *in_R9;
  InstanceSymbol *inst;
  Symbol *symbol;
  Scope *scope;
  uint32_t upwardCount;
  anon_class_48_6_55dedb8f tryMatch;
  Symbol *firstMatch;
  LookupResult *in_stack_fffffffffffffec0;
  Symbol *in_stack_fffffffffffffec8;
  size_t in_stack_fffffffffffffed8;
  char *in_stack_fffffffffffffee0;
  undefined8 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  Scope *in_stack_ffffffffffffff18;
  size_t in_stack_ffffffffffffff20;
  char *in_stack_ffffffffffffff28;
  Symbol *in_stack_ffffffffffffff48;
  anon_class_48_6_55dedb8f *in_stack_ffffffffffffff50;
  Scope *local_80;
  int local_74;
  
  local_74 = 0;
  local_80 = not_null::operator_cast_to_Scope_((not_null<const_slang::ast::Scope_*> *)0x650e4b);
  do {
    name_00._M_str = in_stack_ffffffffffffff28;
    name_00._M_len = in_stack_ffffffffffffff20;
    pSVar2 = Scope::find(in_stack_ffffffffffffff18,name_00);
    if ((((pSVar2 != (Symbol *)0x0) && (bVar1 = Symbol::isValue((Symbol *)0x650eb3), !bVar1)) &&
        (bVar1 = Symbol::isType((Symbol *)0x650ec8), !bVar1)) &&
       ((bVar1 = Symbol::isScope((Symbol *)0x650ed9), bVar1 || (pSVar2->kind == Instance)))) {
      bVar1 = lookupUpward::anon_class_48_6_55dedb8f::operator()
                        (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      if (!bVar1) {
        return false;
      }
      if (*in_R9 != 0) {
        *(int *)(in_R9 + 2) = local_74;
        return true;
      }
    }
    pSVar2 = Scope::asSymbol(local_80);
    if (pSVar2->kind == InstanceBody) {
      pIVar3 = Symbol::as<slang::ast::InstanceBodySymbol>((Symbol *)0x650f88);
      local_80 = Symbol::getParentScope((Symbol *)pIVar3->parentInstance);
      pDVar4 = InstanceSymbol::getDefinition((InstanceSymbol *)0x650fb8);
      in_stack_ffffffffffffff50 = (anon_class_48_6_55dedb8f *)(pDVar4->super_Symbol).name._M_len;
      in_stack_ffffffffffffff48 = *(Symbol **)(in_RDX + 8);
      __x._M_str._0_4_ = in_stack_fffffffffffffef0;
      __x._M_len = in_stack_fffffffffffffee8;
      __x._M_str._4_4_ = in_stack_fffffffffffffef4;
      __y._M_str = in_stack_fffffffffffffee0;
      __y._M_len = in_stack_fffffffffffffed8;
      bVar1 = std::operator==(__x,__y);
      if (bVar1) {
        bVar1 = lookupUpward::anon_class_48_6_55dedb8f::operator()
                          (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
        if (!bVar1) {
          return false;
        }
        if (*in_R9 != 0) {
          *(int *)(in_R9 + 2) = local_74;
          return true;
        }
      }
    }
    else {
      local_80 = Symbol::getHierarchicalParent(in_stack_fffffffffffffec8);
    }
    local_74 = local_74 + 1;
    if (local_80 == (Scope *)0x0) {
      LookupResult::clear(in_stack_fffffffffffffec0);
      return true;
    }
  } while( true );
}

Assistant:

bool lookupUpward(std::span<const NamePlusLoc> nameParts, const NameComponents& name,
                  const ASTContext& context, bitmask<LookupFlags> flags, LookupResult& result) {
    // Upward lookups can match either a scope name, or a module definition name (on any of the
    // instances). Imports are not considered.
    const Symbol* firstMatch = nullptr;
    auto tryMatch = [&](const Symbol& symbol) {
        // Keep track of the first match we find; if it turns out we can't
        // resolve all of the name parts we'll move on and try elsewhere,
        // but at the end if we couldn't find a full match we'll use this to
        // provide a better error.
        if (!firstMatch)
            firstMatch = &symbol;

        result.clear();
        result.found = &symbol;
        return lookupDownward(nameParts, name, context, flags, result);
    };

    uint32_t upwardCount = 0;
    const Scope* scope = context.scope;
    do {
        // Search for a scope or instance target within our current scope.
        auto symbol = scope->find(name.text);
        if (symbol && !symbol->isValue() && !symbol->isType() &&
            (symbol->isScope() || symbol->kind == SymbolKind::Instance)) {
            if (!tryMatch(*symbol))
                return false;

            if (result.found) {
                result.upwardCount = upwardCount;
                return true;
            }
        }

        // Advance to the next scope, skipping to the parent instance when
        // we hit an instance body instead of going on to the compilation unit.
        symbol = &scope->asSymbol();
        if (symbol->kind != SymbolKind::InstanceBody) {
            scope = symbol->getHierarchicalParent();
        }
        else {
            auto inst = symbol->as<InstanceBodySymbol>().parentInstance;
            SLANG_ASSERT(inst);

            // If the instance's definition name matches our target name,
            // try to match from the current instance.
            scope = inst->getParentScope();
            if (inst->getDefinition().name == name.text) {
                if (!tryMatch(*inst))
                    return false;

                if (result.found) {
                    result.upwardCount = upwardCount;
                    return true;
                }
            }
        }

        upwardCount++;
    } while (scope);

    result.clear();
    if (firstMatch) {
        // If we did find a match at some point, repeat that
        // lookup to provide a real error message.
        result.found = firstMatch;
        lookupDownward(nameParts, name, context, flags, result);
        return false;
    }
    return true;
}